

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O2

int nva_rstype(char *name)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = strcmp(name,"bar0");
  iVar3 = 0;
  if ((iVar2 != 0) && (iVar2 = strcmp(name,"mmio"), iVar2 != 0)) {
    iVar2 = strcmp(name,"bar1");
    iVar3 = 1;
    if ((iVar2 != 0) && (((cVar1 = *name, cVar1 != 'f' || (name[1] != 'b')) || (name[2] != '\0'))))
    {
      iVar2 = strcmp(name,"bar2");
      iVar3 = 2;
      if (((iVar2 != 0) && (iVar2 = strcmp(name,"bar3"), iVar2 != 0)) &&
         (iVar2 = strcmp(name,"ramin"), iVar2 != 0)) {
        iVar3 = strcmp(name,"iobar");
        if (iVar3 == 0) {
          iVar3 = 3;
        }
        else {
          iVar3 = strcmp(name,"rawmem");
          if (iVar3 == 0) {
            iVar3 = 4;
          }
          else {
            iVar3 = strcmp(name,"rawio");
            if (iVar3 == 0) {
              iVar3 = 5;
            }
            else {
              iVar3 = strcmp(name,"pdac");
              if (iVar3 == 0) {
                iVar3 = 6;
              }
              else {
                iVar3 = strcmp(name,"eeprom");
                if (iVar3 == 0) {
                  iVar3 = 7;
                }
                else {
                  switch((byte)(cVar1 + 0x9fU) >> 1 | (cVar1 + 0x9fU) * -0x80) {
                  case 0:
                    if ((name[1] == 'r') && (name[2] == '\0')) {
                      return 10;
                    }
                    break;
                  case 1:
                    if ((name[1] == 'r') && (name[2] == '\0')) {
                      return 8;
                    }
                    break;
                  case 3:
                    if ((name[1] == 'r') && (name[2] == '\0')) {
                      return 0xb;
                    }
                    break;
                  case 9:
                    if ((name[1] == 'r') && (name[2] == '\0')) {
                      return 9;
                    }
                  }
                  iVar3 = strcmp(name,"vst");
                  if (iVar3 == 0) {
                    iVar3 = 0xc;
                  }
                  else {
                    iVar3 = strcmp(name,"dpram");
                    if (iVar3 == 0) {
                      iVar3 = 0xd;
                    }
                    else {
                      iVar3 = strcmp(name,"pipe");
                      if (iVar3 == 0) {
                        iVar3 = 0xe;
                      }
                      else {
                        iVar3 = strcmp(name,"rdi");
                        if (iVar3 == 0) {
                          iVar3 = 0xf;
                        }
                        else {
                          iVar3 = strcmp(name,"rdib");
                          if (iVar3 == 0) {
                            iVar3 = 0x10;
                          }
                          else {
                            iVar3 = strcmp(name,"vcomp_code");
                            if (iVar3 == 0) {
                              iVar3 = 0x11;
                            }
                            else {
                              iVar3 = strcmp(name,"vcomp_reg");
                              if (iVar3 == 0) {
                                iVar3 = 0x12;
                              }
                              else {
                                iVar3 = strcmp(name,"macro_code");
                                if (iVar3 == 0) {
                                  iVar3 = 0x13;
                                }
                                else {
                                  iVar3 = 0x15;
                                  if ((cVar1 == 'x') && (name[1] == 't')) {
                                    iVar3 = 0x15 - (uint)(name[2] == '\0');
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int nva_rstype(const char *name) {
	if (!strcmp(name, "bar0"))
		return NVA_REGSPACE_BAR0;
	if (!strcmp(name, "mmio"))
		return NVA_REGSPACE_BAR0;
	if (!strcmp(name, "bar1"))
		return NVA_REGSPACE_BAR1;
	if (!strcmp(name, "fb"))
		return NVA_REGSPACE_BAR1;
	if (!strcmp(name, "bar2"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "bar3"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "ramin"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "iobar"))
		return NVA_REGSPACE_IOBAR;
	if (!strcmp(name, "rawmem"))
		return NVA_REGSPACE_RAWMEM;
	if (!strcmp(name, "rawio"))
		return NVA_REGSPACE_RAWIO;
	if (!strcmp(name, "pdac"))
		return NVA_REGSPACE_PDAC;
	if (!strcmp(name, "eeprom"))
		return NVA_REGSPACE_EEPROM;
	if (!strcmp(name, "cr"))
		return NVA_REGSPACE_VGA_CR;
	if (!strcmp(name, "sr"))
		return NVA_REGSPACE_VGA_SR;
	if (!strcmp(name, "gr"))
		return NVA_REGSPACE_VGA_GR;
	if (!strcmp(name, "ar"))
		return NVA_REGSPACE_VGA_AR;
	if (!strcmp(name, "cr"))
		return NVA_REGSPACE_VGA_CR;
	if (!strcmp(name, "vst"))
		return NVA_REGSPACE_VGA_ST;
	if (!strcmp(name, "dpram"))
		return NVA_REGSPACE_DPRAM;
	if (!strcmp(name, "pipe"))
		return NVA_REGSPACE_PIPE;
	if (!strcmp(name, "rdi"))
		return NVA_REGSPACE_RDI;
	if (!strcmp(name, "rdib"))
		return NVA_REGSPACE_RDIB;
	if (!strcmp(name, "vcomp_code"))
		return NVA_REGSPACE_VCOMP_CODE;
	if (!strcmp(name, "vcomp_reg"))
		return NVA_REGSPACE_VCOMP_REG;
	if (!strcmp(name, "macro_code"))
		return NVA_REGSPACE_MACRO_CODE;
	if (!strcmp(name, "xt"))
		return NVA_REGSPACE_XT;
	return NVA_REGSPACE_UNKNOWN;
}